

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  Logger *info_log;
  undefined1 uVar1;
  bool bVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Version *v;
  Status *s;
  string record;
  string new_manifest_file;
  Builder builder;
  VersionEdit *in_stack_fffffffffffffcb8;
  Version *in_stack_fffffffffffffcc0;
  VersionSet *in_stack_fffffffffffffcc8;
  VersionSet *in_stack_fffffffffffffcd0;
  Version *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  VersionSet *in_stack_fffffffffffffcf8;
  Builder *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  VersionSet *in_stack_fffffffffffffd20;
  Builder *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  Builder *in_stack_fffffffffffffd38;
  VersionSet *this_00;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  Builder *in_stack_fffffffffffffd70;
  undefined1 local_260 [16];
  undefined1 local_250 [24];
  undefined1 local_238 [56];
  undefined1 local_200 [64];
  undefined1 local_1c0 [440];
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDX + 0x41) & 1) == 0) {
    VersionEdit::SetLogNumber(in_stack_fffffffffffffcb8,0x18aed5e);
  }
  else {
    if (*(ulong *)(in_RDX + 0x20) < (ulong)in_RSI[0xc]) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((ulong)in_RSI[9] <= *(ulong *)(in_RDX + 0x20)) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30d,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  if ((*(byte *)(in_RDX + 0x42) & 1) == 0) {
    VersionEdit::SetPrevLogNumber(in_stack_fffffffffffffcb8,0x18aed85);
  }
  VersionEdit::SetNextFile(in_stack_fffffffffffffcb8,0x18aed9e);
  VersionEdit::SetLastSequence(in_stack_fffffffffffffcb8,0x18aedb7);
  pvVar3 = operator_new(0xe8);
  Version::Version(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  Builder::Builder(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                   (Version *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  Builder::Apply(in_stack_fffffffffffffd38,
                 (VersionEdit *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  Builder::SaveTo(in_stack_fffffffffffffd70,
                  (Version *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  Builder::~Builder(in_stack_fffffffffffffd10);
  Finalize(in_stack_fffffffffffffcf8,
           (Version *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd0);
  Status::Status((Status *)in_stack_fffffffffffffcb8);
  if (in_RSI[0xf] == 0) {
    if (in_RSI[0xe] != 0) {
      __assert_fail("descriptor_file_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x328,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    DescriptorFileName((string *)in_stack_fffffffffffffcd0,(uint64_t)in_stack_fffffffffffffcc8);
    this_00 = (VersionSet *)(local_200 + 0x20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(&in_stack_fffffffffffffcb8->comparator_);
    VersionEdit::SetNextFile(in_stack_fffffffffffffcb8,0x18aef85);
    (**(code **)(*(long *)*in_RSI + 0x20))(local_238 + 0x10,(long *)*in_RSI,local_1c0,in_RSI + 0xe);
    in_stack_fffffffffffffd28 = (Builder *)(local_238 + 0x10);
    Status::operator=((Status *)in_stack_fffffffffffffcc8,(Status *)in_stack_fffffffffffffcc0);
    Status::~Status((Status *)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffd37 = Status::ok((Status *)in_stack_fffffffffffffcb8);
    if ((bool)in_stack_fffffffffffffd37) {
      in_stack_fffffffffffffd20 = (VersionSet *)operator_new(0x20);
      log::Writer::Writer((Writer *)in_stack_fffffffffffffcb8,(WritableFile *)0x18af01c);
      in_RSI[0xf] = in_stack_fffffffffffffd20;
      WriteSnapshot(this_00,(Writer *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30))
      ;
      Status::operator=((Status *)in_stack_fffffffffffffcc8,(Status *)in_stack_fffffffffffffcc0);
      Status::~Status((Status *)in_stack_fffffffffffffcb8);
    }
  }
  port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffcb8);
  uVar1 = Status::ok((Status *)in_stack_fffffffffffffcb8);
  if ((bool)uVar1) {
    in_stack_fffffffffffffd10 = (Builder *)local_200;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd0);
    VersionEdit::EncodeTo
              ((VersionEdit *)in_stack_fffffffffffffd28,(string *)in_stack_fffffffffffffd20);
    Slice::Slice((Slice *)in_stack_fffffffffffffcc8,(string *)in_stack_fffffffffffffcc0);
    log::Writer::AddRecord
              ((Writer *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (Slice *)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffcf8 = (VersionSet *)local_238;
    Status::operator=((Status *)in_stack_fffffffffffffcc8,(Status *)in_stack_fffffffffffffcc0);
    Status::~Status((Status *)in_stack_fffffffffffffcb8);
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffcb8);
    if (bVar2) {
      (**(code **)(*(long *)in_RSI[0xe] + 0x28))(local_250);
      Status::operator=((Status *)in_stack_fffffffffffffcc8,(Status *)in_stack_fffffffffffffcc0);
      Status::~Status((Status *)in_stack_fffffffffffffcb8);
    }
    bVar2 = Status::ok((Status *)in_stack_fffffffffffffcb8);
    if (!bVar2) {
      info_log = *(Logger **)(in_RSI[5] + 0x18);
      Status::ToString_abi_cxx11_((Status *)CONCAT17(uVar1,in_stack_fffffffffffffd18));
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&in_stack_fffffffffffffcb8->comparator_);
      Log(info_log,"MANIFEST write: %s\n",pcVar4);
      std::__cxx11::string::~string(&in_stack_fffffffffffffcb8->comparator_);
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffcb8->comparator_);
  }
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffcb8);
  if ((bVar2) &&
     (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&in_stack_fffffffffffffcb8->comparator_), !bVar2)) {
    SetCurrentFile((Env *)in_stack_fffffffffffffd20,
                   (string *)CONCAT17(uVar1,in_stack_fffffffffffffd18),
                   (uint64_t)in_stack_fffffffffffffd10);
    Status::operator=((Status *)in_stack_fffffffffffffcc8,(Status *)in_stack_fffffffffffffcc0);
    Status::~Status((Status *)in_stack_fffffffffffffcb8);
  }
  port::Mutex::Lock((Mutex *)in_stack_fffffffffffffcb8);
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffcb8);
  if (bVar2) {
    AppendVersion(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    in_RSI[0xc] = *(undefined8 *)(in_RDX + 0x20);
    in_RSI[0xd] = *(undefined8 *)(in_RDX + 0x28);
  }
  else {
    if (pvVar3 != (void *)0x0) {
      Version::~Version((Version *)in_stack_fffffffffffffcf8);
      operator_delete(pvVar3,0xe8);
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&in_stack_fffffffffffffcb8->comparator_);
    if (!bVar2) {
      pvVar3 = (void *)in_RSI[0xf];
      if (pvVar3 != (void *)0x0) {
        log::Writer::~Writer((Writer *)in_stack_fffffffffffffcb8);
        operator_delete(pvVar3,0x20);
      }
      if ((long *)in_RSI[0xe] != (long *)0x0) {
        (**(code **)(*(long *)in_RSI[0xe] + 8))();
      }
      in_RSI[0xf] = 0;
      in_RSI[0xe] = 0;
      (**(code **)(*(long *)*in_RSI + 0x40))(local_260,(long *)*in_RSI,local_1c0);
      Status::~Status((Status *)in_stack_fffffffffffffcb8);
    }
  }
  std::__cxx11::string::~string(&in_stack_fffffffffffffcb8->comparator_);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->DeleteFile(new_manifest_file);
    }
  }

  return s;
}